

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

pattern * idItem(void)

{
  char *__s1;
  int iVar1;
  ushort **ppuVar2;
  pattern *ppVar3;
  char local_f8 [8];
  char msg [200];
  char *local_28;
  char *tmpstr;
  char *s;
  int val;
  int type;
  pattern *lhs;
  
  __s1 = SymTable[tokenval].lexptr;
  iVar1 = strncmp(__s1,"FILE",4);
  if ((iVar1 == 0) && (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)__s1[4]] & 0x800) != 0)) {
    s._4_4_ = 0x130;
    s._0_4_ = parseInteger(__s1,4,10);
  }
  else {
    iVar1 = strncmp(__s1,"CHAIN",5);
    if ((iVar1 == 0) &&
       ((ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)__s1[5]] & 8) != 0 || (__s1[5] == '_')))) {
      s._4_4_ = 0x132;
      for (local_28 = __s1 + 5; *local_28 != '\0'; local_28 = local_28 + 1) {
        if (*local_28 == '_') {
          *local_28 = ' ';
        }
      }
      if (__s1[6] == '\0') {
        __s1[4] = ' ';
        s._0_4_ = lookup(__s1 + 4);
        if ((uint)s == 0) {
          s._0_4_ = insert(__s1 + 4,0x193);
        }
      }
      else {
        s._0_4_ = lookup(__s1 + 5);
        if ((uint)s == 0) {
          s._0_4_ = insert(__s1 + 5,0x193);
        }
      }
    }
    else {
      iVar1 = strncmp(__s1,"ALT",3);
      if ((iVar1 == 0) &&
         ((ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)__s1[3]] & 8) != 0 || (__s1[3] == '_')))) {
        if (__s1[3] == '_') {
          __s1[3] = ' ';
        }
        s._4_4_ = 0x133;
        s._0_4_ = (uint)(byte)__s1[3];
      }
      else {
        iVar1 = strncmp(__s1,"MODEL",5);
        if ((iVar1 == 0) && (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)__s1[5]] & 0x800) != 0)) {
          s._4_4_ = 0x131;
          s._0_4_ = parseInteger(__s1,5,10);
        }
        else {
          iVar1 = strncmp(__s1,"ATOM",4);
          if ((iVar1 == 0) &&
             ((ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)__s1[4]] & 8) != 0 || (__s1[4] == '_'))))
          {
            s._4_4_ = 0x139;
            for (local_28 = __s1 + 4; *local_28 != '\0'; local_28 = local_28 + 1) {
              if (*local_28 == '_') {
                *local_28 = ' ';
              }
            }
            s._0_4_ = lookup(__s1 + 4);
            if ((uint)s == 0) {
              s._0_4_ = insert(__s1 + 4,0x193);
            }
          }
          else {
            iVar1 = strncmp(__s1,"SEG",3);
            if ((iVar1 == 0) &&
               ((ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)__s1[3]] & 8) != 0 || (__s1[3] == '_'))
               )) {
              s._4_4_ = 0x13f;
              for (local_28 = __s1 + 3; *local_28 != '\0'; local_28 = local_28 + 1) {
                if (*local_28 == '_') {
                  *local_28 = ' ';
                }
              }
              s._0_4_ = lookup(__s1 + 3);
              if ((uint)s == 0) {
                s._0_4_ = insert(__s1 + 3,0x193);
              }
            }
            else {
              iVar1 = strcmp(__s1,"ALL");
              if (iVar1 == 0) {
                s._4_4_ = 0x136;
                s._0_4_ = 0;
              }
              else {
                iVar1 = strcmp(__s1,"NONE");
                if (iVar1 == 0) {
                  s._4_4_ = 0x137;
                  s._0_4_ = 0;
                }
                else {
                  iVar1 = strcmp(__s1,"ALPHA");
                  if (iVar1 == 0) {
                    s._4_4_ = 0x138;
                    s._0_4_ = 4;
                  }
                  else {
                    iVar1 = strcmp(__s1,"BETA");
                    if (iVar1 == 0) {
                      s._4_4_ = 0x138;
                      s._0_4_ = 8;
                    }
                    else {
                      iVar1 = strcmp(__s1,"MAINCHAIN");
                      if (((iVar1 == 0) || (iVar1 = strcmp(__s1,"MC"), iVar1 == 0)) ||
                         (iVar1 = strcmp(__s1,"BACKBONE"), iVar1 == 0)) {
                        s._4_4_ = 0x138;
                        s._0_4_ = 1;
                      }
                      else {
                        iVar1 = strcmp(__s1,"SIDECHAIN");
                        if (((iVar1 == 0) || (iVar1 = strcmp(__s1,"SC"), iVar1 == 0)) ||
                           (iVar1 = strcmp(__s1,"BASE"), iVar1 == 0)) {
                          s._4_4_ = 0x138;
                          s._0_4_ = 2;
                        }
                        else {
                          iVar1 = strcmp(__s1,"NITROGEN");
                          if (iVar1 == 0) {
                            s._4_4_ = 0x138;
                            s._0_4_ = 0x10;
                          }
                          else {
                            iVar1 = strcmp(__s1,"CARBON");
                            if (iVar1 == 0) {
                              s._4_4_ = 0x138;
                              s._0_4_ = 0x20;
                            }
                            else {
                              iVar1 = strcmp(__s1,"OXYGEN");
                              if (iVar1 == 0) {
                                s._4_4_ = 0x138;
                                s._0_4_ = 0x40;
                              }
                              else {
                                iVar1 = strcmp(__s1,"SULFUR");
                                if (iVar1 == 0) {
                                  s._4_4_ = 0x138;
                                  s._0_4_ = 0x80;
                                }
                                else {
                                  iVar1 = strcmp(__s1,"PHOSPHORUS");
                                  if (iVar1 == 0) {
                                    s._4_4_ = 0x138;
                                    s._0_4_ = 0x100;
                                  }
                                  else {
                                    iVar1 = strcmp(__s1,"HYDROGEN");
                                    if (iVar1 == 0) {
                                      s._4_4_ = 0x138;
                                      s._0_4_ = 0x200;
                                    }
                                    else {
                                      iVar1 = strcmp(__s1,"H2O");
                                      if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"WATER"), iVar1 == 0)
                                         ) {
                                        s._4_4_ = 0x138;
                                        s._0_4_ = 0x400;
                                      }
                                      else {
                                        iVar1 = strcmp(__s1,"HET");
                                        if ((iVar1 == 0) ||
                                           (iVar1 = strcmp(__s1,"HETATM"), iVar1 == 0)) {
                                          s._4_4_ = 0x138;
                                          s._0_4_ = 0x800;
                                        }
                                        else {
                                          iVar1 = strcmp(__s1,"PROTEIN");
                                          if ((iVar1 == 0) ||
                                             (iVar1 = strcmp(__s1,"PEPTIDE"), iVar1 == 0)) {
                                            s._4_4_ = 0x138;
                                            s._0_4_ = 0x1000;
                                          }
                                          else {
                                            iVar1 = strcmp(__s1,"DNA");
                                            if ((iVar1 == 0) ||
                                               (iVar1 = strcmp(__s1,"RNA"), iVar1 == 0)) {
                                              s._4_4_ = 0x138;
                                              s._0_4_ = 0x2000;
                                            }
                                            else {
                                              iVar1 = strcmp(__s1,"METAL");
                                              if (iVar1 == 0) {
                                                s._4_4_ = 0x138;
                                                s._0_4_ = 0x4000;
                                              }
                                              else {
                                                iVar1 = strcmp(__s1,"METHYLENE");
                                                if (iVar1 == 0) {
                                                  s._4_4_ = 0x138;
                                                  s._0_4_ = 0x40000000;
                                                }
                                                else {
                                                  iVar1 = strcmp(__s1,"METHYL");
                                                  if (iVar1 == 0) {
                                                    s._4_4_ = 0x138;
                                                    s._0_4_ = 0x8000;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(__s1,"DONOR");
                                                    if (iVar1 == 0) {
                                                      s._4_4_ = 0x138;
                                                      s._0_4_ = 0x10000;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(__s1,"ACCEPTOR");
                                                      if (iVar1 == 0) {
                                                        s._4_4_ = 0x138;
                                                        s._0_4_ = 0x20000;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(__s1,"NONPOLAR");
                                                        if ((((iVar1 == 0) ||
                                                             (iVar1 = strcmp(__s1,"HYDROPHOBIC"),
                                                             iVar1 == 0)) ||
                                                            (iVar1 = strcmp(__s1,"HPHOBIC"),
                                                            iVar1 == 0)) ||
                                                           (iVar1 = strcmp(__s1,"PHOBIC"),
                                                           iVar1 == 0)) {
                                                          s._4_4_ = 0x138;
                                                          s._0_4_ = 0x800000;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(__s1,"POLAR");
                                                          if (((iVar1 == 0) ||
                                                              (iVar1 = strcmp(__s1,"HYDROPHILIC"),
                                                              iVar1 == 0)) ||
                                                             ((iVar1 = strcmp(__s1,"HPHILIC"),
                                                              iVar1 == 0 ||
                                                              (iVar1 = strcmp(__s1,"PHILIC"),
                                                              iVar1 == 0)))) {
                                                            s._4_4_ = 0x138;
                                                            s._0_4_ = 0x1000000;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(__s1,"CHARGED");
                                                            if ((iVar1 == 0) ||
                                                               (iVar1 = strcmp(__s1,"CHARGE"),
                                                               iVar1 == 0)) {
                                                              s._4_4_ = 0x138;
                                                              s._0_4_ = 0x2000000;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(__s1,"AROMATIC");
                                                              if (iVar1 == 0) {
                                                                s._4_4_ = 0x138;
                                                                s._0_4_ = 0x40000;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(__s1,"GLY");
                                                                if ((iVar1 == 0) ||
                                                                   (iVar1 = strcmp(__s1,"G"),
                                                                   iVar1 == 0)) {
                                                                  s._4_4_ = 0x135;
                                                                  s._0_4_ = lookup("GLY");
                                                                  if ((uint)s == 0) {
                                                                    s._0_4_ = insert("GLY",0x193);
                                                                  }
                                                                }
                                                                else {
                                                                  iVar1 = strcmp(__s1,"ALA");
                                                                  if ((iVar1 == 0) ||
                                                                     (iVar1 = strcmp(__s1,"A"),
                                                                     iVar1 == 0)) {
                                                                    s._4_4_ = 0x135;
                                                                    s._0_4_ = lookup("ALA");
                                                                    if ((uint)s == 0) {
                                                                      s._0_4_ = insert("ALA",0x193);
                                                                    }
                                                                  }
                                                                  else {
                                                                    iVar1 = strcmp(__s1,"VAL");
                                                                    if ((iVar1 == 0) ||
                                                                       (iVar1 = strcmp(__s1,"V"),
                                                                       iVar1 == 0)) {
                                                                      s._4_4_ = 0x135;
                                                                      s._0_4_ = lookup("VAL");
                                                                      if ((uint)s == 0) {
                                                                        s._0_4_ = insert("VAL",0x193
                                                                                        );
                                                                      }
                                                                    }
                                                                    else {
                                                                      iVar1 = strcmp(__s1,"PHE");
                                                                      if ((iVar1 == 0) ||
                                                                         (iVar1 = strcmp(__s1,"F"),
                                                                         iVar1 == 0)) {
                                                                        s._4_4_ = 0x135;
                                                                        s._0_4_ = lookup("PHE");
                                                                        if ((uint)s == 0) {
                                                                          s._0_4_ = insert("PHE",
                                                  0x193);
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(__s1,"PRO");
                                                    if ((iVar1 == 0) ||
                                                       (iVar1 = strcmp(__s1,"P"), iVar1 == 0)) {
                                                      s._4_4_ = 0x135;
                                                      s._0_4_ = lookup("PRO");
                                                      if ((uint)s == 0) {
                                                        s._0_4_ = insert("PRO",0x193);
                                                      }
                                                    }
                                                    else {
                                                      iVar1 = strcmp(__s1,"MET");
                                                      if ((iVar1 == 0) ||
                                                         (iVar1 = strcmp(__s1,"M"), iVar1 == 0)) {
                                                        s._4_4_ = 0x135;
                                                        s._0_4_ = lookup("MET");
                                                        if ((uint)s == 0) {
                                                          s._0_4_ = insert("MET",0x193);
                                                        }
                                                      }
                                                      else {
                                                        iVar1 = strcmp(__s1,"ILE");
                                                        if ((iVar1 == 0) ||
                                                           (iVar1 = strcmp(__s1,"I"), iVar1 == 0)) {
                                                          s._4_4_ = 0x135;
                                                          s._0_4_ = lookup("ILE");
                                                          if ((uint)s == 0) {
                                                            s._0_4_ = insert("ILE",0x193);
                                                          }
                                                        }
                                                        else {
                                                          iVar1 = strcmp(__s1,"LEU");
                                                          if ((iVar1 == 0) ||
                                                             (iVar1 = strcmp(__s1,"L"), iVar1 == 0))
                                                          {
                                                            s._4_4_ = 0x135;
                                                            s._0_4_ = lookup("LEU");
                                                            if ((uint)s == 0) {
                                                              s._0_4_ = insert("LEU",0x193);
                                                            }
                                                          }
                                                          else {
                                                            iVar1 = strcmp(__s1,"ASP");
                                                            if ((iVar1 == 0) ||
                                                               (iVar1 = strcmp(__s1,"D"), iVar1 == 0
                                                               )) {
                                                              s._4_4_ = 0x135;
                                                              s._0_4_ = lookup("ASP");
                                                              if ((uint)s == 0) {
                                                                s._0_4_ = insert("ASP",0x193);
                                                              }
                                                            }
                                                            else {
                                                              iVar1 = strcmp(__s1,"GLU");
                                                              if ((iVar1 == 0) ||
                                                                 (iVar1 = strcmp(__s1,"E"),
                                                                 iVar1 == 0)) {
                                                                s._4_4_ = 0x135;
                                                                s._0_4_ = lookup("GLU");
                                                                if ((uint)s == 0) {
                                                                  s._0_4_ = insert("GLU",0x193);
                                                                }
                                                              }
                                                              else {
                                                                iVar1 = strcmp(__s1,"LYS");
                                                                if ((iVar1 == 0) ||
                                                                   (iVar1 = strcmp(__s1,"K"),
                                                                   iVar1 == 0)) {
                                                                  s._4_4_ = 0x135;
                                                                  s._0_4_ = lookup("LYS");
                                                                  if ((uint)s == 0) {
                                                                    s._0_4_ = insert("LYS",0x193);
                                                                  }
                                                                }
                                                                else {
                                                                  iVar1 = strcmp(__s1,"ARG");
                                                                  if ((iVar1 == 0) ||
                                                                     (iVar1 = strcmp(__s1,"R"),
                                                                     iVar1 == 0)) {
                                                                    s._4_4_ = 0x135;
                                                                    s._0_4_ = lookup("ARG");
                                                                    if ((uint)s == 0) {
                                                                      s._0_4_ = insert("ARG",0x193);
                                                                    }
                                                                  }
                                                                  else {
                                                                    iVar1 = strcmp(__s1,"SER");
                                                                    if ((iVar1 == 0) ||
                                                                       (iVar1 = strcmp(__s1,"S"),
                                                                       iVar1 == 0)) {
                                                                      s._4_4_ = 0x135;
                                                                      s._0_4_ = lookup("SER");
                                                                      if ((uint)s == 0) {
                                                                        s._0_4_ = insert("SER",0x193
                                                                                        );
                                                                      }
                                                                    }
                                                                    else {
                                                                      iVar1 = strcmp(__s1,"THR");
                                                                      if ((iVar1 == 0) ||
                                                                         (iVar1 = strcmp(__s1,"T"),
                                                                         iVar1 == 0)) {
                                                                        s._4_4_ = 0x135;
                                                                        s._0_4_ = lookup("THR");
                                                                        if ((uint)s == 0) {
                                                                          s._0_4_ = insert("THR",
                                                  0x193);
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(__s1,"TYR");
                                                    if ((iVar1 == 0) ||
                                                       (iVar1 = strcmp(__s1,"Y"), iVar1 == 0)) {
                                                      s._4_4_ = 0x135;
                                                      s._0_4_ = lookup("TYR");
                                                      if ((uint)s == 0) {
                                                        s._0_4_ = insert("TYR",0x193);
                                                      }
                                                    }
                                                    else {
                                                      iVar1 = strcmp(__s1,"HIS");
                                                      if ((iVar1 == 0) ||
                                                         (iVar1 = strcmp(__s1,"H"), iVar1 == 0)) {
                                                        s._4_4_ = 0x135;
                                                        s._0_4_ = lookup("HIS");
                                                        if ((uint)s == 0) {
                                                          s._0_4_ = insert("HIS",0x193);
                                                        }
                                                      }
                                                      else {
                                                        iVar1 = strcmp(__s1,"CYS");
                                                        if ((iVar1 == 0) ||
                                                           (iVar1 = strcmp(__s1,"C"), iVar1 == 0)) {
                                                          s._4_4_ = 0x135;
                                                          s._0_4_ = lookup("CYS");
                                                          if ((uint)s == 0) {
                                                            s._0_4_ = insert("CYS",0x193);
                                                          }
                                                        }
                                                        else {
                                                          iVar1 = strcmp(__s1,"ASN");
                                                          if ((iVar1 == 0) ||
                                                             (iVar1 = strcmp(__s1,"N"), iVar1 == 0))
                                                          {
                                                            s._4_4_ = 0x135;
                                                            s._0_4_ = lookup("ASN");
                                                            if ((uint)s == 0) {
                                                              s._0_4_ = insert("ASN",0x193);
                                                            }
                                                          }
                                                          else {
                                                            iVar1 = strcmp(__s1,"GLN");
                                                            if ((iVar1 == 0) ||
                                                               (iVar1 = strcmp(__s1,"Q"), iVar1 == 0
                                                               )) {
                                                              s._4_4_ = 0x135;
                                                              s._0_4_ = lookup("GLN");
                                                              if ((uint)s == 0) {
                                                                s._0_4_ = insert("GLN",0x193);
                                                              }
                                                            }
                                                            else {
                                                              iVar1 = strcmp(__s1,"TRP");
                                                              if ((iVar1 == 0) ||
                                                                 (iVar1 = strcmp(__s1,"W"),
                                                                 iVar1 == 0)) {
                                                                s._4_4_ = 0x135;
                                                                s._0_4_ = lookup("TRP");
                                                                if ((uint)s == 0) {
                                                                  s._0_4_ = insert("TRP",0x193);
                                                                }
                                                              }
                                                              else {
                                                                iVar1 = strcmp(__s1,"ACE");
                                                                if (iVar1 == 0) {
                                                                  s._4_4_ = 0x135;
                                                                  s._0_4_ = lookup("ACE");
                                                                  if ((uint)s == 0) {
                                                                    s._0_4_ = insert("ACE",0x193);
                                                                  }
                                                                }
                                                                else {
                                                                  iVar1 = strcmp(__s1,"ASX");
                                                                  if (iVar1 == 0) {
                                                                    s._4_4_ = 0x135;
                                                                    s._0_4_ = lookup("ASX");
                                                                    if ((uint)s == 0) {
                                                                      s._0_4_ = insert("ASX",0x193);
                                                                    }
                                                                  }
                                                                  else {
                                                                    iVar1 = strcmp(__s1,"GLX");
                                                                    if (iVar1 == 0) {
                                                                      s._4_4_ = 0x135;
                                                                      s._0_4_ = lookup("GLX");
                                                                      if ((uint)s == 0) {
                                                                        s._0_4_ = insert("GLX",0x193
                                                                                        );
                                                                      }
                                                                    }
                                                                    else {
                                                                      iVar1 = strcmp(__s1,"MSE");
                                                                      if (iVar1 == 0) {
                                                                        s._4_4_ = 0x135;
                                                                        s._0_4_ = lookup("MSE");
                                                                        if ((uint)s == 0) {
                                                                          s._0_4_ = insert("MSE",
                                                  0x193);
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(__s1,"PCA");
                                                    if (iVar1 == 0) {
                                                      s._4_4_ = 0x135;
                                                      s._0_4_ = lookup("PCA");
                                                      if ((uint)s == 0) {
                                                        s._0_4_ = insert("PCA",0x193);
                                                      }
                                                    }
                                                    else {
                                                      iVar1 = strcmp(__s1,"NH2");
                                                      if (iVar1 == 0) {
                                                        s._4_4_ = 0x135;
                                                        s._0_4_ = lookup("NH2");
                                                        if ((uint)s == 0) {
                                                          s._0_4_ = insert("NH2",0x193);
                                                        }
                                                      }
                                                      else {
                                                        iVar1 = strcmp(__s1,"NME");
                                                        if (iVar1 == 0) {
                                                          s._4_4_ = 0x135;
                                                          s._0_4_ = lookup("NME");
                                                          if ((uint)s == 0) {
                                                            s._0_4_ = insert("NME",0x193);
                                                          }
                                                        }
                                                        else {
                                                          iVar1 = strcmp(__s1,"FOR");
                                                          if (iVar1 == 0) {
                                                            s._4_4_ = 0x135;
                                                            s._0_4_ = lookup("FOR");
                                                            if ((uint)s == 0) {
                                                              s._0_4_ = insert("FOR",0x193);
                                                            }
                                                          }
                                                          else {
                                                            iVar1 = strncmp(__s1,"RES",3);
                                                            if ((iVar1 == 0) &&
                                                               ((ppuVar2 = __ctype_b_loc(),
                                                                ((*ppuVar2)[(int)__s1[3]] & 8) != 0
                                                                || (__s1[3] == '_')))) {
                                                              s._4_4_ = 0x135;
                                                              for (local_28 = __s1 + 3;
                                                                  *local_28 != '\0';
                                                                  local_28 = local_28 + 1) {
                                                                if (*local_28 == '_') {
                                                                  *local_28 = ' ';
                                                                }
                                                              }
                                                              s._0_4_ = lookup(__s1 + 3);
                                                              if ((uint)s == 0) {
                                                                s._0_4_ = insert(__s1 + 3,0x193);
                                                              }
                                                            }
                                                            else {
                                                              iVar1 = strncmp(__s1,"OLT",3);
                                                              if ((iVar1 == 0) &&
                                                                 (ppuVar2 = __ctype_b_loc(),
                                                                 ((*ppuVar2)[(int)__s1[3]] & 0x800)
                                                                 != 0)) {
                                                                s._4_4_ = 0x13a;
                                                                s._0_4_ = parseInteger(__s1,3,10);
                                                              }
                                                              else {
                                                                iVar1 = strncmp(__s1,"OGT",3);
                                                                if ((iVar1 == 0) &&
                                                                   (ppuVar2 = __ctype_b_loc(),
                                                                   ((*ppuVar2)[(int)__s1[3]] & 0x800
                                                                   ) != 0)) {
                                                                  s._4_4_ = 0x13b;
                                                                  s._0_4_ = parseInteger(__s1,3,10);
                                                                }
                                                                else {
                                                                  iVar1 = strncmp(__s1,"BLT",3);
                                                                  if ((iVar1 == 0) &&
                                                                     (ppuVar2 = __ctype_b_loc(),
                                                                     ((*ppuVar2)[(int)__s1[3]] &
                                                                     0x800) != 0)) {
                                                                    s._4_4_ = 0x13c;
                                                                    s._0_4_ = parseInteger(__s1,3,10
                                                                                          );
                                                                  }
                                                                  else {
                                                                    iVar1 = strncmp(__s1,"BGT",3);
                                                                    if ((iVar1 == 0) &&
                                                                       (ppuVar2 = __ctype_b_loc(),
                                                                       ((*ppuVar2)[(int)__s1[3]] &
                                                                       0x800) != 0)) {
                                                                      s._4_4_ = 0x13d;
                                                                      s._0_4_ = parseInteger(__s1,3,
                                                  10);
                                                  }
                                                  else {
                                                    iVar1 = strncmp(__s1,"INS",3);
                                                    if ((iVar1 == 0) &&
                                                       ((ppuVar2 = __ctype_b_loc(),
                                                        ((*ppuVar2)[(int)__s1[3]] & 8) != 0 ||
                                                        (__s1[3] == '_')))) {
                                                      if (__s1[3] == '_') {
                                                        __s1[3] = ' ';
                                                      }
                                                      s._4_4_ = 0x140;
                                                      s._0_4_ = (uint)(byte)__s1[3];
                                                    }
                                                    else {
                                                      sprintf(local_f8,
                                                  "syntax: unknown identifier: %s",__s1);
                                                  errmsg(local_f8);
                                                  ParseError = 1;
                                                  s._4_4_ = 0x137;
                                                  s._0_4_ = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ppVar3 = makeTerminal(s._4_4_,(uint)s);
  matchTok(0x193);
  return ppVar3;
}

Assistant:

pattern* idItem() {
   pattern *lhs = NULL;
   int type = 0, val = 0;
   char *s, *tmpstr;

   s = SymTable[tokenval].lexptr;

   if ((strncmp(s, "FILE", 4) == 0) && isdigit(s[4])) {
      type = FILE_NODE; val = parseInteger(s,4,10);
   }
   else if ((strncmp(s, "CHAIN", 5) == 0) && (isalnum(s[5])||(s[5]=='_'))) {
      type = CHAIN_NODE;
      for(tmpstr = s+5;  *tmpstr; tmpstr++) { /* substitute blank for _ */
         if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      if (s[6] == '\0') { 
         s[4] = ' ';
         val = lookup(s+4); if(val == 0) val = insert(s+4, ID_TOK);
      }
      else {
         val = lookup(s+5); if(val == 0) val = insert(s+5, ID_TOK);
      }
     /* type = CHAIN_NODE; val = (unsigned char)s[5]; */
   }
   else if ((strncmp(s, "ALT", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      if (s[3] == '_') {s[3] = ' ';}
      type = ALT_NODE; val = (unsigned char)s[3];
   }
   else if ((strncmp(s, "MODEL", 5) == 0) && isdigit(s[5])) {
      type = MODEL_NODE; val = parseInteger(s,5,10);
   }
   else if ((strncmp(s, "ATOM", 4) == 0) && (isalnum(s[4])||(s[4]=='_'))) {
      type = ANAME_NODE;
      for(tmpstr = s+4; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+4); if(val == 0) val = insert(s+4, ID_TOK);
   }
   else if ((strncmp(s, "SEG", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      type = SEGID_NODE;
      for(tmpstr = s+3; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+3); if(val == 0) val = insert(s+3, ID_TOK);
   }
   else if (strcmp(s, "ALL") == 0) {
      type = TRUE_NODE; val = 0;
   }
   else if (strcmp(s, "NONE") == 0) {
      type = FALSE_NODE; val = 0;
   }
   else if (strcmp(s, "ALPHA") == 0) {
      type = PROP_NODE; val = ALPHA_PROP;
   }
   else if (strcmp(s, "BETA") == 0) {
      type = PROP_NODE; val = BETA_PROP;
   }
   else if ((strcmp(s, "MAINCHAIN") == 0) || (strcmp(s, "MC") == 0)
        ||  (strcmp(s, "BACKBONE") == 0)) {
      type = PROP_NODE; val = MC_PROP;
   }
   else if ((strcmp(s, "SIDECHAIN") == 0) || (strcmp(s, "SC") == 0)
        ||  (strcmp(s, "BASE") == 0)) {
      type = PROP_NODE; val = SC_PROP;
   }
   else if (strcmp(s, "NITROGEN") == 0) {
      type = PROP_NODE; val = N_PROP;
   }
   else if (strcmp(s, "CARBON") == 0) {
      type = PROP_NODE; val = C_PROP;
   }
   else if (strcmp(s, "OXYGEN") == 0) {
      type = PROP_NODE; val = O_PROP;
   }
   else if (strcmp(s, "SULFUR") == 0) {
      type = PROP_NODE; val = S_PROP;
   }
   else if (strcmp(s, "PHOSPHORUS") == 0) {
      type = PROP_NODE; val = P_PROP;
   }
   else if (strcmp(s, "HYDROGEN") == 0) {
      type = PROP_NODE; val = H_PROP;
   }
   else if ((strcmp(s, "H2O") == 0) || (strcmp(s, "WATER") == 0)) {
      type = PROP_NODE; val = WATER_PROP;
   }
   else if ((strcmp(s, "HET") == 0) || (strcmp(s, "HETATM") == 0)) {
      type = PROP_NODE; val = HET_PROP;
   }
   else if ((strcmp(s, "PROTEIN") == 0) || (strcmp(s, "PEPTIDE") == 0)) {
      type = PROP_NODE; val = PROT_PROP;
   }
   else if ((strcmp(s, "DNA") == 0) || (strcmp(s, "RNA") == 0)) {
      type = PROP_NODE; val = DNA_PROP;
   }
   else if (strcmp(s, "METAL") == 0) {
      type = PROP_NODE; val = METAL_PROP;
   }
   else if (strcmp(s, "METHYLENE") == 0) {
      type = PROP_NODE; val = METHYLENE_PROP;
   }/*longer name first*/
      else if (strcmp(s, "METHYL") == 0) {
      type = PROP_NODE; val = METHYL_PROP;
   }
   else if (strcmp(s, "DONOR") == 0) {
      type = PROP_NODE; val = DONOR_PROP;
   }
   else if (strcmp(s, "ACCEPTOR") == 0) {
      type = PROP_NODE; val = ACCEPTOR_PROP;
   }
   else if ((strcmp(s, "NONPOLAR") == 0) || (strcmp(s, "HYDROPHOBIC") == 0)
        ||  (strcmp(s, "HPHOBIC")== 0)|| (strcmp(s, "PHOBIC") == 0)) {
      type = PROP_NODE; val = RHPHOBIC_PROP;
   }
   else if ((strcmp(s, "POLAR") == 0) || (strcmp(s, "HYDROPHILIC") == 0)
        ||  (strcmp(s, "HPHILIC")== 0)|| (strcmp(s, "PHILIC") == 0)) {
      type = PROP_NODE; val = RHPHILIC_PROP;
   }
   else if ((strcmp(s, "CHARGED") == 0) || (strcmp(s, "CHARGE") == 0)) {
      type = PROP_NODE; val = RCHARGED_PROP;
   }
   else if (strcmp(s, "AROMATIC") == 0) {
      type = PROP_NODE; val = AROMATIC_PROP;
   }
   else if ((strcmp(s, "GLY") == 0) || (strcmp(s, "G") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLY"); if(val == 0) val = insert("GLY", ID_TOK);
   }
   else if ((strcmp(s, "ALA") == 0) || (strcmp(s, "A") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ALA"); if(val == 0) val = insert("ALA", ID_TOK);
   }
   else if ((strcmp(s, "VAL") == 0) || (strcmp(s, "V") == 0)) {
      type = RTYPE_NODE;
      val = lookup("VAL"); if(val == 0) val = insert("VAL", ID_TOK);
   }
   else if ((strcmp(s, "PHE") == 0) || (strcmp(s, "F") == 0)) {
      type = RTYPE_NODE;
      val = lookup("PHE"); if(val == 0) val = insert("PHE", ID_TOK);
   }
   else if ((strcmp(s, "PRO") == 0) || (strcmp(s, "P") == 0)) {
      type = RTYPE_NODE;
      val = lookup("PRO"); if(val == 0) val = insert("PRO", ID_TOK);
   }
   else if ((strcmp(s, "MET") == 0) || (strcmp(s, "M") == 0)) {
      type = RTYPE_NODE;
      val = lookup("MET"); if(val == 0) val = insert("MET", ID_TOK);
   }
   else if ((strcmp(s, "ILE") == 0) || (strcmp(s, "I") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ILE"); if(val == 0) val = insert("ILE", ID_TOK);
   }
   else if ((strcmp(s, "LEU") == 0) || (strcmp(s, "L") == 0)) {
      type = RTYPE_NODE;
      val = lookup("LEU"); if(val == 0) val = insert("LEU", ID_TOK);
   }
   else if ((strcmp(s, "ASP") == 0) || (strcmp(s, "D") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ASP"); if(val == 0) val = insert("ASP", ID_TOK);
   }
   else if ((strcmp(s, "GLU") == 0) || (strcmp(s, "E") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLU"); if(val == 0) val = insert("GLU", ID_TOK);
   }
   else if ((strcmp(s, "LYS") == 0) || (strcmp(s, "K") == 0)) {
      type = RTYPE_NODE;
      val = lookup("LYS"); if(val == 0) val = insert("LYS", ID_TOK);
   }
   else if ((strcmp(s, "ARG") == 0) || (strcmp(s, "R") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ARG"); if(val == 0) val = insert("ARG", ID_TOK);
   }
   else if ((strcmp(s, "SER") == 0) || (strcmp(s, "S") == 0)) {
      type = RTYPE_NODE;
      val = lookup("SER"); if(val == 0) val = insert("SER", ID_TOK);
   }
   else if ((strcmp(s, "THR") == 0) || (strcmp(s, "T") == 0)) {
      type = RTYPE_NODE;
      val = lookup("THR"); if(val == 0) val = insert("THR", ID_TOK);
   }
   else if ((strcmp(s, "TYR") == 0) || (strcmp(s, "Y") == 0)) {
      type = RTYPE_NODE;
      val = lookup("TYR"); if(val == 0) val = insert("TYR", ID_TOK);
   }
   else if ((strcmp(s, "HIS") == 0) || (strcmp(s, "H") == 0)) {
      type = RTYPE_NODE;
      val = lookup("HIS"); if(val == 0) val = insert("HIS", ID_TOK);
   }
   else if ((strcmp(s, "CYS") == 0) || (strcmp(s, "C") == 0)) {
      type = RTYPE_NODE;
      val = lookup("CYS"); if(val == 0) val = insert("CYS", ID_TOK);
   }
   else if ((strcmp(s, "ASN") == 0) || (strcmp(s, "N") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ASN"); if(val == 0) val = insert("ASN", ID_TOK);
   }
   else if ((strcmp(s, "GLN") == 0) || (strcmp(s, "Q") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLN"); if(val == 0) val = insert("GLN", ID_TOK);
   }
   else if ((strcmp(s, "TRP") == 0) || (strcmp(s, "W") == 0)) {
      type = RTYPE_NODE;
      val = lookup("TRP"); if(val == 0) val = insert("TRP", ID_TOK);
   }
   else if (strcmp(s, "ACE") == 0) {
      type = RTYPE_NODE;
      val = lookup("ACE"); if(val == 0) val = insert("ACE", ID_TOK);
   }
   else if (strcmp(s, "ASX") == 0) {
      type = RTYPE_NODE;
      val = lookup("ASX"); if(val == 0) val = insert("ASX", ID_TOK);
   }
   else if (strcmp(s, "GLX") == 0) {
      type = RTYPE_NODE;
      val = lookup("GLX"); if(val == 0) val = insert("GLX", ID_TOK);
   }
   else if (strcmp(s, "MSE") == 0) {
      type = RTYPE_NODE;
      val = lookup("MSE"); if(val == 0) val = insert("MSE", ID_TOK);
   }
   else if (strcmp(s, "PCA") == 0) {
      type = RTYPE_NODE;
      val = lookup("PCA"); if(val == 0) val = insert("PCA", ID_TOK);
   }
   else if (strcmp(s, "NH2") == 0) {
      type = RTYPE_NODE;
      val = lookup("NH2"); if(val == 0) val = insert("NH2", ID_TOK);
   }
   else if (strcmp(s, "NME") == 0) {
      type = RTYPE_NODE;
      val = lookup("NME"); if(val == 0) val = insert("NME", ID_TOK);
   }
   else if (strcmp(s, "FOR") == 0) {
      type = RTYPE_NODE;
      val = lookup("FOR"); if(val == 0) val = insert("FOR", ID_TOK);
   }
   else if ((strncmp(s, "RES", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      type = RTYPE_NODE;
      for(tmpstr = s+3; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+3); if(val == 0) val = insert(s+3, ID_TOK);
   }
   else if ((strncmp(s, "OLT", 3) == 0) && isdigit(s[3])) {
      type = OCC_LT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "OGT", 3) == 0) && isdigit(s[3])) {
      type = OCC_GT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "BLT", 3) == 0) && isdigit(s[3])) {
      type = B_LT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "BGT", 3) == 0) && isdigit(s[3])) {
      type = B_GT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "INS", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      if (s[3] == '_') {s[3] = ' ';}
      type = INS_NODE; val = (unsigned char)s[3];
   }
   else {
        char msg[200];
	sprintf(msg,"syntax: unknown identifier: %s", s);
	errmsg(msg);
	ParseError = TRUE;
        type = FALSE_NODE;
        val = 0;
   }

   lhs = makeTerminal(type, val);
   matchTok(ID_TOK);
   return lhs;
}